

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O3

Reals __thiscall Omega_h::measure_edges_metric(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *metrics)

{
  int *piVar1;
  uint uVar2;
  Alloc *pAVar3;
  LO nmetrics;
  uint uVar4;
  undefined8 uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  Alloc *pAVar10;
  Reals RVar11;
  LOs local_100;
  LOs local_f0;
  LOs local_e0;
  LOs local_d0;
  LOs local_c0;
  Reals local_b0;
  Reals local_a0;
  Reals local_90;
  Reals local_80;
  Reals local_70;
  Reals local_60;
  undefined1 local_50 [32];
  void *pvVar6;
  
  pAVar10 = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)pAVar10 & 1) == 0) {
    uVar8 = pAVar10->size;
  }
  else {
    uVar8 = (ulong)pAVar10 >> 3;
  }
  if ((int)(uVar8 >> 2) == 0) {
    local_50._0_8_ = (Alloc *)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50);
    Read<double>::Read((Read<double> *)this,(initializer_list<double>)ZEXT816(0),(string *)local_50)
    ;
    pvVar6 = extraout_RDX;
    if ((Alloc *)local_50._0_8_ == (Alloc *)(local_50 + 0x10)) goto LAB_003b6488;
    uVar8 = local_50._16_8_ + 1;
    pAVar10 = (Alloc *)local_50._0_8_;
  }
  else {
    nmetrics = Mesh::nverts(mesh);
    local_60.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
    if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.write_.shared_alloc_.alloc =
             (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_60.write_.shared_alloc_.alloc)->use_count =
             (local_60.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
    uVar4 = get_metrics_dim(nmetrics,&local_60);
    pAVar10 = local_60.write_.shared_alloc_.alloc;
    if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
        operator_delete(pAVar10,0x48);
      }
    }
    uVar2 = mesh->dim_;
    if (3 < uVar2) {
      pcVar9 = "0 <= dim_ && dim_ <= 3";
      pcVar7 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
      ;
      uVar5 = 0x33;
LAB_003b64b7:
      fail("assertion %s failed at %s +%d\n",pcVar9,pcVar7,uVar5);
    }
    if (uVar4 == 3 && (uVar2 ^ 3) == 0) {
      local_c0.write_.shared_alloc_.alloc = (a2e->write_).shared_alloc_.alloc;
      if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c0.write_.shared_alloc_.alloc =
               (Alloc *)((local_c0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_c0.write_.shared_alloc_.alloc)->use_count =
               (local_c0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_c0.write_.shared_alloc_.direct_ptr = (a2e->write_).shared_alloc_.direct_ptr;
      local_70.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
      if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
          local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_70.write_.shared_alloc_.alloc =
               (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_70.write_.shared_alloc_.alloc)->use_count =
               (local_70.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_70.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
      RVar11 = measure_edges_metric_tmpl<3,3>(this,mesh,&local_c0,&local_70);
      pAVar3 = local_70.write_.shared_alloc_.alloc;
      pvVar6 = RVar11.write_.shared_alloc_.direct_ptr;
      pAVar10 = local_c0.write_.shared_alloc_.alloc;
      if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
          local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
          pvVar6 = extraout_RDX_00;
          pAVar10 = local_c0.write_.shared_alloc_.alloc;
        }
      }
    }
    else if (uVar4 == 2 && (uVar2 ^ 2) == 0) {
      local_d0.write_.shared_alloc_.alloc = (a2e->write_).shared_alloc_.alloc;
      if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_d0.write_.shared_alloc_.alloc =
               (Alloc *)((local_d0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_d0.write_.shared_alloc_.alloc)->use_count =
               (local_d0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_d0.write_.shared_alloc_.direct_ptr = (a2e->write_).shared_alloc_.direct_ptr;
      local_80.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
      if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
          local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_80.write_.shared_alloc_.alloc =
               (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_80.write_.shared_alloc_.alloc)->use_count =
               (local_80.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_80.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
      RVar11 = measure_edges_metric_tmpl<2,2>(this,mesh,&local_d0,&local_80);
      pAVar3 = local_80.write_.shared_alloc_.alloc;
      pvVar6 = RVar11.write_.shared_alloc_.direct_ptr;
      pAVar10 = local_d0.write_.shared_alloc_.alloc;
      if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
          local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
          pvVar6 = extraout_RDX_01;
          pAVar10 = local_d0.write_.shared_alloc_.alloc;
        }
      }
    }
    else if ((uVar2 ^ 3) == 0 && (uVar4 ^ 1) == 0) {
      local_e0.write_.shared_alloc_.alloc = (a2e->write_).shared_alloc_.alloc;
      if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_e0.write_.shared_alloc_.alloc =
               (Alloc *)((local_e0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_e0.write_.shared_alloc_.alloc)->use_count =
               (local_e0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_e0.write_.shared_alloc_.direct_ptr = (a2e->write_).shared_alloc_.direct_ptr;
      local_90.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
      if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_90.write_.shared_alloc_.alloc =
               (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_90.write_.shared_alloc_.alloc)->use_count =
               (local_90.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_90.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
      RVar11 = measure_edges_metric_tmpl<3,1>(this,mesh,&local_e0,&local_90);
      pAVar3 = local_90.write_.shared_alloc_.alloc;
      pvVar6 = RVar11.write_.shared_alloc_.direct_ptr;
      pAVar10 = local_e0.write_.shared_alloc_.alloc;
      if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
          pvVar6 = extraout_RDX_02;
          pAVar10 = local_e0.write_.shared_alloc_.alloc;
        }
      }
    }
    else if ((uVar4 ^ 1) == 0 && (uVar2 ^ 2) == 0) {
      local_f0.write_.shared_alloc_.alloc = (a2e->write_).shared_alloc_.alloc;
      if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f0.write_.shared_alloc_.alloc =
               (Alloc *)((local_f0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_f0.write_.shared_alloc_.alloc)->use_count =
               (local_f0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_f0.write_.shared_alloc_.direct_ptr = (a2e->write_).shared_alloc_.direct_ptr;
      local_a0.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
      if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_a0.write_.shared_alloc_.alloc =
               (Alloc *)((local_a0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_a0.write_.shared_alloc_.alloc)->use_count =
               (local_a0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_a0.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
      RVar11 = measure_edges_metric_tmpl<2,1>(this,mesh,&local_f0,&local_a0);
      pAVar3 = local_a0.write_.shared_alloc_.alloc;
      pvVar6 = RVar11.write_.shared_alloc_.direct_ptr;
      pAVar10 = local_f0.write_.shared_alloc_.alloc;
      if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
          pvVar6 = extraout_RDX_03;
          pAVar10 = local_f0.write_.shared_alloc_.alloc;
        }
      }
    }
    else {
      if ((uVar4 != 1) || (uVar2 != 1)) {
        pcVar9 = "false";
        pcVar7 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_shape.cpp"
        ;
        uVar5 = 0x24;
        goto LAB_003b64b7;
      }
      local_100.write_.shared_alloc_.alloc = (a2e->write_).shared_alloc_.alloc;
      if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
          local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_100.write_.shared_alloc_.alloc =
               (Alloc *)((local_100.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_100.write_.shared_alloc_.alloc)->use_count =
               (local_100.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_100.write_.shared_alloc_.direct_ptr = (a2e->write_).shared_alloc_.direct_ptr;
      local_b0.write_.shared_alloc_.alloc = (metrics->write_).shared_alloc_.alloc;
      if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b0.write_.shared_alloc_.alloc =
               (Alloc *)((local_b0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_b0.write_.shared_alloc_.alloc)->use_count =
               (local_b0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_b0.write_.shared_alloc_.direct_ptr = (metrics->write_).shared_alloc_.direct_ptr;
      RVar11 = measure_edges_metric_tmpl<1,1>(this,mesh,&local_100,&local_b0);
      pAVar3 = local_b0.write_.shared_alloc_.alloc;
      pvVar6 = RVar11.write_.shared_alloc_.direct_ptr;
      pAVar10 = local_100.write_.shared_alloc_.alloc;
      if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
          pvVar6 = extraout_RDX_04;
          pAVar10 = local_100.write_.shared_alloc_.alloc;
        }
      }
    }
    if (((ulong)pAVar10 & 7) != 0 || pAVar10 == (Alloc *)0x0) goto LAB_003b6488;
    piVar1 = &pAVar10->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) goto LAB_003b6488;
    Alloc::~Alloc(pAVar10);
    uVar8 = 0x48;
  }
  operator_delete(pAVar10,uVar8);
  pvVar6 = extraout_RDX_05;
LAB_003b6488:
  RVar11.write_.shared_alloc_.direct_ptr = pvVar6;
  RVar11.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar11.write_.shared_alloc_;
}

Assistant:

Reals measure_edges_metric(Mesh* mesh, LOs a2e, Reals metrics) {
  if (a2e.size() == 0) return Reals({});
  auto metric_dim = get_metrics_dim(mesh->nverts(), metrics);
  if (mesh->dim() == 3 && metric_dim == 3) {
    return measure_edges_metric_tmpl<3, 3>(mesh, a2e, metrics);
  } else if (mesh->dim() == 2 && metric_dim == 2) {
    return measure_edges_metric_tmpl<2, 2>(mesh, a2e, metrics);
  } else if (mesh->dim() == 3 && metric_dim == 1) {
    return measure_edges_metric_tmpl<3, 1>(mesh, a2e, metrics);
  } else if (mesh->dim() == 2 && metric_dim == 1) {
    return measure_edges_metric_tmpl<2, 1>(mesh, a2e, metrics);
  } else if (mesh->dim() == 1 && metric_dim == 1) {
    return measure_edges_metric_tmpl<1, 1>(mesh, a2e, metrics);
  }
  OMEGA_H_NORETURN(Reals());
}